

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicExtensionTest_Test::TestBody
          (MessageDifferencerTest_BasicExtensionTest_Test *this)

{
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestAllExtensions msg2;
  TestAllExtensions msg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  AssertHelper local_a8;
  internal local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string local_90;
  TestAllExtensions local_70;
  TestAllExtensions local_40;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_40,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_70,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&local_40);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&local_70);
  local_a0[0] = (internal)
                util::MessageDifferencer::Equals(&local_40.super_Message,&local_70.super_Message);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a0[0]) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,local_a0,(AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x49d,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_40);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicExtensionTest) {
  // Create the testing protos
  unittest::TestAllExtensions msg1;
  unittest::TestAllExtensions msg2;

  TestUtil::SetAllExtensions(&msg1);
  TestUtil::SetAllExtensions(&msg2);

  // Compare
  EXPECT_TRUE(util::MessageDifferencer::Equals(msg1, msg2));
}